

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

DefaultShaderSourceStreamFactory * __thiscall
Diligent::MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator> *this
          ,char **CtorArgs)

{
  char **ppcVar1;
  DefaultShaderSourceStreamFactory *local_30;
  DefaultShaderSourceStreamFactory *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  char **CtorArgs_local;
  MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppcVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (DefaultShaderSourceStreamFactory *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (DefaultShaderSourceStreamFactory *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_30 = (DefaultShaderSourceStreamFactory *)
               RefCountedObject<Diligent::IShaderSourceInputStreamFactory>::operator_new
                         ((RefCountedObject<Diligent::IShaderSourceInputStreamFactory> *)0x28,
                          (size_t)ppcVar1);
    DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
              (local_30,(IReferenceCounters *)pObj,*CtorArgs);
  }
  else {
    local_30 = (DefaultShaderSourceStreamFactory *)
               new<Diligent::IMemoryAllocator>
                         (0x28,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
              (local_30,(IReferenceCounters *)pObj,*CtorArgs);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_30,*(IMemoryAllocator **)this);
  }
  return local_30;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }